

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportTryCompileFileGenerator::FindTargets
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,string *propName,
          cmGeneratorTarget *tgt,string *language,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  bool bVar1;
  cmMakefile *mf;
  cmLocalGenerator *pcVar2;
  pointer pcVar3;
  string *psVar4;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *this_00;
  reference ppcVar5;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar6;
  cmGeneratorTarget *local_728;
  cmGeneratorTarget *target;
  iterator __end1;
  iterator __begin1;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range1;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *allTargets;
  undefined1 local_6f8 [8];
  cmGeneratorTarget gDummyHead;
  string local_148;
  cmTarget local_128;
  cmTarget dummyHead;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_f8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  cmListFileBacktrace local_68;
  undefined1 local_50 [8];
  cmGeneratorExpression ge;
  char *prop;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *emitted_local;
  string *language_local;
  cmGeneratorTarget *tgt_local;
  string *propName_local;
  cmExportTryCompileFileGenerator *this_local;
  string *result;
  
  ge.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         cmGeneratorTarget::GetProperty(tgt,propName);
  if (ge.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    local_68.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_68);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_50,&local_68);
    cmListFileBacktrace::~cmListFileBacktrace(&local_68);
    std::__cxx11::string::string((string *)&cge,(string *)propName);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_f8,tgt,(string *)&cge,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&dummyHead,local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"try_compile_dummy_exe",
               (allocator<char> *)
               ((long)&gDummyHead.MaxLanguageStandards._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    mf = cmTarget::GetMakefile(tgt->Target);
    cmTarget::cmTarget(&local_128,&local_148,EXECUTABLE,VisibilityNormal,mf);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gDummyHead.MaxLanguageStandards._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    pcVar2 = cmGeneratorTarget::GetLocalGenerator(tgt);
    cmGeneratorTarget::cmGeneratorTarget((cmGeneratorTarget *)local_6f8,&local_128,pcVar2);
    pcVar3 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&dummyHead);
    pcVar2 = cmGeneratorTarget::GetLocalGenerator(tgt);
    psVar4 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar3,pcVar2,&this->Config,false,(cmGeneratorTarget *)local_6f8,tgt,
                        (cmGeneratorExpressionDAGChecker *)local_f8,language);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
    pcVar3 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&dummyHead);
    this_00 = cmCompiledGeneratorExpression::GetAllTargetsSeen(pcVar3);
    __end1 = std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::begin(this_00);
    target = (cmGeneratorTarget *)
             std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::end(this_00);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&target), bVar1) {
      ppcVar5 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end1);
      local_728 = *ppcVar5;
      pVar6 = std::
              set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              ::insert(emitted,&local_728);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
        push_back(&this->Exports,&local_728);
      }
      std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end1);
    }
    cmGeneratorTarget::~cmGeneratorTarget((cmGeneratorTarget *)local_6f8);
    cmTarget::~cmTarget(&local_128);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&dummyHead);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_f8);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::FindTargets(
  const std::string& propName, cmGeneratorTarget const* tgt,
  std::string const& language, std::set<cmGeneratorTarget const*>& emitted)
{
  const char* prop = tgt->GetProperty(propName);
  if (!prop) {
    return std::string();
  }

  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(tgt, propName, nullptr, nullptr);

  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop);

  cmTarget dummyHead("try_compile_dummy_exe", cmStateEnums::EXECUTABLE,
                     cmTarget::VisibilityNormal, tgt->Target->GetMakefile());

  cmGeneratorTarget gDummyHead(&dummyHead, tgt->GetLocalGenerator());

  std::string result =
    cge->Evaluate(tgt->GetLocalGenerator(), this->Config, false, &gDummyHead,
                  tgt, &dagChecker, language);

  const std::set<cmGeneratorTarget const*>& allTargets =
    cge->GetAllTargetsSeen();
  for (cmGeneratorTarget const* target : allTargets) {
    if (emitted.insert(target).second) {
      this->Exports.push_back(target);
    }
  }
  return result;
}